

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::init
          (HelperInvocationDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  ostringstream *this_01;
  pointer pcVar1;
  RenderContext *renderCtx;
  ShaderProgram *this_02;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long *plVar4;
  FboHelper *this_03;
  long *extraout_RAX;
  TestError *this_04;
  int height;
  long *plVar5;
  undefined8 in_R8;
  int in_R9D;
  long lVar6;
  string funcSource;
  int v;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  ShaderProgram *local_2a0;
  long *local_298;
  long local_290;
  long local_288 [2];
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long *local_258;
  long local_250;
  long local_248;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  long *local_238 [2];
  long local_228 [2];
  RenderContext *local_218;
  uint local_210;
  value_type local_208;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_1e8;
  uint local_1d8;
  value_type local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  local_218 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*local_218->_vptr_RenderContext[3])();
  local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8d57,local_1b0);
  dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                  ,0x96);
  iVar2 = this->m_numSamples;
  if (this->m_numSamples == -1) {
    iVar2 = local_1b0._0_4_;
  }
  if (this->m_checkAbsoluteValue == true) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   "abs(",&this->m_derivateFunc);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_1b0);
    local_2c0 = &local_2b0;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_2b0 = *plVar5;
      lStack_2a8 = plVar4[3];
    }
    else {
      local_2b0 = *plVar5;
      local_2c0 = (long *)*plVar4;
    }
    local_2b8 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
  }
  else {
    local_2c0 = &local_2b0;
    pcVar1 = (this->m_derivateFunc)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c0,pcVar1,pcVar1 + (this->m_derivateFunc)._M_string_length);
    std::__cxx11::string::append((char *)&local_2c0);
  }
  local_2a0 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,
             "#version 310 es\nin highp vec2 a_position;\nuniform highp float u_pointSize;\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tgl_PointSize = u_pointSize;\n}\n"
             ,"");
  local_210 = 0;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_298,local_290 + (long)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (ulong)local_210 * 0x18),&local_208);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,
             "#version 310 es\nout mediump vec4 o_color;\nvoid main (void)\n{\n\thighp float value\t\t= gl_HelperInvocation ? 1.0 : 0.0;\n\thighp float derivate\t= "
             ,"");
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_238,(ulong)local_2c0);
  local_278 = &local_268;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_268 = *plVar5;
    lStack_260 = plVar4[3];
  }
  else {
    local_268 = *plVar5;
    local_278 = (long *)*plVar4;
  }
  local_270 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_248 = *plVar5;
    uStack_240 = (undefined4)plVar4[3];
    uStack_23c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_258 = &local_248;
  }
  else {
    local_248 = *plVar5;
    local_258 = (long *)*plVar4;
  }
  local_250 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1d8 = 1;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_258,local_250 + (long)local_258);
  this_02 = local_2a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (ulong)local_1d8 * 0x18),&local_1d0);
  glu::ShaderProgram::ShaderProgram(this_02,renderCtx,(ProgramSources *)local_1b0);
  local_1e8.m_data.ptr = (ShaderProgram *)0x0;
  this_00 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      this_02) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&this_00->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = this_02;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar6));
    dVar3 = (deUint32)in_R8;
    height = (int)plVar5;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                  m_data.ptr);
  if ((((this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
        m_data.ptr)->m_program).m_info.linkOk != false) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_01 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"Using GL_RGBA8 framebuffer with ",0x20);
    std::ostream::operator<<(this_01,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," samples",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_138);
    this_03 = (FboHelper *)operator_new(0x78);
    FboHelper::FboHelper(this_03,local_218,iVar2,height,dVar3,in_R9D);
    local_1b0._0_8_ = (pointer)0x0;
    if ((this->m_fbo).
        super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
        .m_data.ptr != this_03) {
      de::details::
      UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
      ::reset(&(this->m_fbo).
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
             );
      (this->m_fbo).
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
      .m_data.ptr = this_03;
    }
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
             *)local_1b0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    plVar4 = &local_2b0;
    if (local_2c0 != plVar4) {
      operator_delete(local_2c0,local_2b0 + 1);
      plVar4 = extraout_RAX;
    }
    return (int)plVar4;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
            );
  this_04 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_04,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
             ,0x20d);
  __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void HelperInvocationDerivateCase::init (void)
{
	const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
	const glw::Functions&		gl				= renderCtx.getFunctions();
	const int					maxSamples		= getInteger(gl, GL_MAX_SAMPLES);
	const int					actualSamples	= m_numSamples == NUM_SAMPLES_MAX ? maxSamples : m_numSamples;
	const std::string			funcSource		= (m_checkAbsoluteValue) ? ("abs(" + m_derivateFunc + "(value))") : (m_derivateFunc + "(value)");

	m_program = MovePtr<ShaderProgram>(new ShaderProgram(m_context.getRenderContext(),
		glu::ProgramSources()
			<< glu::VertexSource(
				"#version 310 es\n"
				"in highp vec2 a_position;\n"
				"uniform highp float u_pointSize;\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
				"	gl_PointSize = u_pointSize;\n"
				"}\n")
			<< glu::FragmentSource(string(
				"#version 310 es\n"
				"out mediump vec4 o_color;\n"
				"void main (void)\n"
				"{\n"
				"	highp float value		= gl_HelperInvocation ? 1.0 : 0.0;\n"
				"	highp float derivate	= ") + funcSource + ";\n"
				"	if (gl_HelperInvocation)\n"
				"		o_color = vec4(1.0, 0.0, derivate, 1.0);\n"
				"	else\n"
				"		o_color = vec4(0.0, 1.0, derivate, 1.0);\n"
				"}\n")));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		m_program.clear();
		TCU_FAIL("Compile failed");
	}

	m_testCtx.getLog() << TestLog::Message << "Using GL_RGBA8 framebuffer with "
					   << actualSamples << " samples" << TestLog::EndMessage;

	m_fbo = MovePtr<FboHelper>(new FboHelper(renderCtx, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT,
											 FRAMEBUFFER_FORMAT, actualSamples));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}